

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Acb_Ntk_t * Acb_VerilogSimpleRead(char *pFileName,char *pFileNameW)

{
  Vec_Int_t *pModule_00;
  Vec_Int_t *pNames_00;
  char *pFileName_00;
  int nNameIdMax;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *vWeights;
  void *pModule;
  Vec_Int_t *vBuffer;
  Abc_Nam_t *pNames;
  Acb_Ntk_t *pNtk;
  char *pFileNameW_local;
  char *pFileName_local;
  
  pNtk = (Acb_Ntk_t *)pFileNameW;
  pFileNameW_local = pFileName;
  vBuffer = (Vec_Int_t *)Acb_VerilogStartNames();
  pModule = Acb_VerilogSimpleLex(pFileNameW_local,(Abc_Nam_t *)vBuffer);
  if ((Vec_Int_t *)pModule == (Vec_Int_t *)0x0) {
    local_50 = (Vec_Int_t *)0x0;
  }
  else {
    local_50 = (Vec_Int_t *)Acb_VerilogSimpleParse((Vec_Int_t *)pModule,(Abc_Nam_t *)vBuffer);
  }
  vWeights = local_50;
  if (pNtk == (Acb_Ntk_t *)0x0) {
    local_58 = (Vec_Int_t *)0x0;
  }
  else {
    local_58 = Acb_ReadWeightMap((char *)pNtk,(Abc_Nam_t *)vBuffer);
  }
  pFileName_00 = pFileNameW_local;
  pNames_00 = vBuffer;
  pModule_00 = vWeights;
  local_48 = local_58;
  if ((pFileNameW_local == (char *)0x0) || (vWeights != (Vec_Int_t *)0x0)) {
    if ((pNtk == (Acb_Ntk_t *)0x0) || (local_58 != (Vec_Int_t *)0x0)) {
      nNameIdMax = Abc_NamObjNumMax((Abc_Nam_t *)vBuffer);
      pNames = (Abc_Nam_t *)
               Acb_NtkFromNdr(pFileName_00,pModule_00,(Abc_Nam_t *)pNames_00,local_58,nNameIdMax);
      Ndr_Delete(vWeights);
      Vec_IntFree((Vec_Int_t *)pModule);
      Vec_IntFreeP(&local_48);
      Abc_NamDeref((Abc_Nam_t *)vBuffer);
      pFileName_local = (char *)pNames;
    }
    else {
      printf("Cannot read weight file \"%s\".\n",pNtk);
      pFileName_local = (char *)0x0;
    }
  }
  else {
    printf("Cannot read input file \"%s\".\n",pFileNameW_local);
    pFileName_local = (char *)0x0;
  }
  return (Acb_Ntk_t *)pFileName_local;
}

Assistant:

Acb_Ntk_t * Acb_VerilogSimpleRead( char * pFileName, char * pFileNameW )
{
    extern Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax );
    Acb_Ntk_t * pNtk;
    Abc_Nam_t * pNames = Acb_VerilogStartNames();
    Vec_Int_t * vBuffer = Acb_VerilogSimpleLex( pFileName, pNames );
    void * pModule = vBuffer ? Acb_VerilogSimpleParse( vBuffer, pNames ) : NULL;
    Vec_Int_t * vWeights = pFileNameW ? Acb_ReadWeightMap( pFileNameW, pNames ) : NULL;
    if ( pFileName && pModule == NULL )
    {
        printf( "Cannot read input file \"%s\".\n", pFileName );
        return NULL;
    }
    if ( pFileNameW && vWeights == NULL )
    {
        printf( "Cannot read weight file \"%s\".\n", pFileNameW );
        return NULL;
    }
//    Ndr_ModuleWriteVerilog( "iccad17/unit1/test.v", pModule, pNameStrs );
    pNtk = Acb_NtkFromNdr( pFileName, pModule, pNames, vWeights, Abc_NamObjNumMax(pNames) );
    Ndr_Delete( pModule );
    Vec_IntFree( vBuffer );
    Vec_IntFreeP( &vWeights );
    Abc_NamDeref( pNames );
    return pNtk;
}